

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

wchar_t object_to_ac(object *obj)

{
  int local_18;
  wchar_t local_14;
  wchar_t i;
  wchar_t result;
  object *obj_local;
  
  local_14 = (wchar_t)obj->to_a;
  if (obj->curses != (curse_data *)0x0) {
    for (local_18 = 1; local_18 < (int)(uint)z_info->curse_max; local_18 = local_18 + 1) {
      if (obj->curses[local_18].power != L'\0') {
        local_14 = (curses[local_18].obj)->to_a + local_14;
      }
    }
  }
  return local_14;
}

Assistant:

int object_to_ac(const struct object *obj)
{
	int result = obj->to_a;

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result += curses[i].obj->to_a;
			}
		}
	}
	return result;
}